

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O0

void pgraph_load_pipe(int cnum,uint32_t addr,uint32_t *data,int num)

{
  uint32_t uVar1;
  int local_24;
  int local_20;
  int ctr;
  int i;
  int num_local;
  uint32_t *data_local;
  uint32_t addr_local;
  int cnum_local;
  
  nva_wr32(cnum,0x400f50,addr);
  for (local_20 = 0; local_20 < num; local_20 = local_20 + 1) {
    nva_wr32(cnum,0x400f54,data[local_20]);
  }
  local_24 = 0;
  while (uVar1 = nva_rd32(cnum,0x400700), uVar1 != 0) {
    local_24 = local_24 + 1;
    if (local_24 == 10000) {
      uVar1 = nva_rd32(cnum,0x400700);
      printf("PIPE write hang on %04x: %08x\n",(ulong)addr,(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void pgraph_load_pipe(int cnum, uint32_t addr, uint32_t *data, int num) {
	nva_wr32(cnum, 0x400f50, addr);
	for (int i = 0; i < num; i++)
		nva_wr32(cnum, 0x400f54, data[i]);
	int ctr = 0;
	while (nva_rd32(cnum, 0x400700)) {
		ctr++;
		if (ctr == 10000) {
			printf("PIPE write hang on %04x: %08x\n", addr, nva_rd32(cnum, 0x400700));
		}
	}
}